

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool MultiplicationHelper<unsigned_long,_int,_6>::Multiply
               (unsigned_long *t,int *u,unsigned_long *ret)

{
  bool bVar1;
  uint64_t tmp;
  uint64_t t1;
  uint64_t local_20;
  unsigned_long local_18;
  
  local_18 = *t;
  local_20 = 0;
  bVar1 = LargeIntRegMultiply<unsigned_long,_int>::RegMultiply(&local_18,*u,&local_20);
  *ret = local_20;
  return bVar1;
}

Assistant:

static bool Multiply(const T& t, const U& u, T& ret) SAFEINT_NOTHROW
    {
        static_assert(safeint_internal::int_traits<T>::isUint64, "T must be Uint64");
        std::uint64_t t1 = t;
        std::uint64_t tmp = 0;
        bool f = LargeIntRegMultiply< std::uint64_t, std::int32_t >::RegMultiply(t1, (std::int32_t)u, &tmp);
        ret = tmp;
        return f;
    }